

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

LogicalExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this,int opcode)

{
  Kind kind;
  Kind KVar1;
  BinaryReader<mp::internal::IdentityConverter> *pBVar2;
  char *pcVar3;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *pNVar4;
  BasicProblem<mp::BasicProblemParams<int>_> *pBVar5;
  int iVar6;
  NumericExpr NVar7;
  CountExpr CVar8;
  ExprBase EVar9;
  ExprBase EVar10;
  LogicalExpr LVar11;
  LogicalExpr LVar12;
  LogicalExpr LVar13;
  Impl *pIVar14;
  ExprBase EVar15;
  long lVar16;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)66,_(mp::expr::Kind)67>_>
  BVar17;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  BVar18;
  Impl *local_58;
  undefined8 uStack_50;
  ArgList local_40;
  
  kind = OpCodeInfo::INFO[opcode].kind;
  KVar1 = OpCodeInfo::INFO[opcode].first_kind;
  if ((int)KVar1 < 0x3b) {
    if (KVar1 == NOT) {
      pNVar4 = this->handler_;
      LVar13 = ReadLogicalExpr(this);
      pBVar5 = pNVar4->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar5->super_ExprFactory).exprs_,&local_58);
      pIVar14 = (Impl *)operator_new__(0x80);
      pIVar14->kind_ = NOT;
      (pBVar5->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = pIVar14;
      *(ExprBase *)&pIVar14[2].kind_ = LVar13.super_ExprBase.impl_;
      return (LogicalExpr)pIVar14;
    }
    if (KVar1 == FIRST_BINARY_LOGICAL) {
      EVar9.impl_ = (Impl *)ReadLogicalExpr(this);
      EVar10.impl_ = (Impl *)ReadLogicalExpr(this);
    }
    else {
      if (KVar1 != FIRST_RELATIONAL) goto switchD_001fe43b_caseD_3c;
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      EVar9.impl_ = (Impl *)ReadNumericExpr(this,*pcVar3,false);
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      EVar10.impl_ = (Impl *)ReadNumericExpr(this,*pcVar3,false);
    }
    pBVar5 = this->handler_->builder_;
    local_58 = (Impl *)0x0;
    std::
    vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
    ::emplace_back<mp::internal::ExprBase::Impl_const*>
              ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                *)&(pBVar5->super_ExprFactory).exprs_,&local_58);
    EVar15.impl_ = (Impl *)operator_new__(0xc0);
    (EVar15.impl_)->kind_ = kind;
    (pBVar5->super_ExprFactory).exprs_.
    super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar15.impl_;
    *(Impl **)(EVar15.impl_ + 2) = EVar9.impl_;
    *(Impl **)(EVar15.impl_ + 4) = EVar10.impl_;
  }
  else {
    switch(KVar1) {
    case ATLEAST:
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      NVar7 = ReadNumericExpr(this,*pcVar3,false);
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      if ((*pcVar3 != 'o') || (iVar6 = ReadOpCode(this), OpCodeInfo::INFO[iVar6].kind != COUNT)) {
        local_58 = (Impl *)0x0;
        uStack_50 = 0;
        local_40.types_ = 0;
        local_40.field_1.values_ = (Value *)&local_58;
        BinaryReaderBase::ReportError
                  (&this->reader_->super_BinaryReaderBase,(CStringRef)0x22b4d5,&local_40);
      }
      pNVar4 = this->handler_;
      CVar8 = ReadCountExpr(this);
      pBVar5 = pNVar4->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar5->super_ExprFactory).exprs_,&local_58);
      EVar15.impl_ = (Impl *)operator_new__(0xc0);
      (EVar15.impl_)->kind_ = kind;
      (pBVar5->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar15.impl_;
      *(ExprBase *)&EVar15.impl_[2].kind_ = NVar7.super_ExprBase.impl_;
      *(BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47> *)&EVar15.impl_[4].kind_ =
           CVar8.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.impl_;
      break;
    default:
switchD_001fe43b_caseD_3c:
      local_58 = (Impl *)0x0;
      uStack_50 = 0;
      local_40.types_ = 0;
      local_40.field_1.values_ = (Value *)&local_58;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x22b4ef,&local_40);
      EVar15.impl_ = (Impl *)0x0;
      break;
    case IMPLICATION:
      LVar13 = ReadLogicalExpr(this);
      LVar11 = ReadLogicalExpr(this);
      LVar12 = ReadLogicalExpr(this);
      pBVar5 = this->handler_->builder_;
      local_58 = (Impl *)0x0;
      std::
      vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
      ::emplace_back<mp::internal::ExprBase::Impl_const*>
                ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
                  *)&(pBVar5->super_ExprFactory).exprs_,&local_58);
      EVar15.impl_ = (Impl *)operator_new__(0x100);
      (EVar15.impl_)->kind_ = IMPLICATION;
      (pBVar5->super_ExprFactory).exprs_.
      super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1] = EVar15.impl_;
      *(ExprBase *)&EVar15.impl_[2].kind_ = LVar13.super_ExprBase.impl_;
      *(ExprBase *)&EVar15.impl_[4].kind_ = LVar11.super_ExprBase.impl_;
      *(ExprBase *)&EVar15.impl_[6].kind_ = LVar12.super_ExprBase.impl_;
      break;
    case EXISTS:
      iVar6 = ReadNumArgs(this,3);
      BVar17 = BasicExprFactory<std::allocator<char>>::
               BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)66,(mp::expr::Kind)67>>
                         ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,kind,
                          iVar6);
      EVar15.impl_ = &(BVar17.impl_)->super_Impl;
      if (0 < iVar6) {
        lVar16 = 0;
        do {
          EVar9.impl_ = (Impl *)ReadLogicalExpr(this);
          ((Impl *)EVar15.impl_)->args[BVar17.arg_index_ + lVar16] = EVar9.impl_;
          lVar16 = lVar16 + 1;
        } while (iVar6 != (int)lVar16);
      }
      break;
    case ALLDIFF:
      iVar6 = ReadNumArgs(this,1);
      BVar18 = BasicExprFactory<std::allocator<char>>::
               BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
                         ((BasicExprFactory<std::allocator<char>> *)this->handler_->builder_,kind,
                          iVar6);
      EVar15.impl_ = &(BVar18.impl_)->super_Impl;
      if (0 < iVar6) {
        lVar16 = 0;
        do {
          pBVar2 = this->reader_;
          pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
          (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
          EVar9.impl_ = (Impl *)ReadNumericExpr(this,*pcVar3,false);
          ((Impl *)EVar15.impl_)->args[BVar18.arg_index_ + lVar16] = EVar9.impl_;
          lVar16 = lVar16 + 1;
        } while (iVar6 != (int)lVar16);
      }
    }
  }
  return (LogicalExpr)(ExprBase)EVar15.impl_;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}